

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O3

char nsvg__parseFillRule(char *str)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = strcmp(str,"nonzero");
  if (iVar1 == 0) {
    bVar2 = false;
  }
  else {
    iVar1 = strcmp(str,"evenodd");
    bVar2 = iVar1 == 0;
  }
  return bVar2;
}

Assistant:

static char nsvg__parseFillRule(const char* str)
{
	if (strcmp(str, "nonzero") == 0)
		return NSVG_FILLRULE_NONZERO;
	else if (strcmp(str, "evenodd") == 0)
		return NSVG_FILLRULE_EVENODD;
	// TODO: handle inherit.
	return NSVG_FILLRULE_NONZERO;
}